

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.c
# Opt level: O0

void boolean(ch_compilation *comp)

{
  undefined4 local_1c;
  undefined4 local_18;
  ch_op op_1;
  ch_op op;
  ch_token_kind kind;
  ch_compilation *comp_local;
  
  op_1 = (comp->previous).kind;
  _op = comp;
  if (op_1 == TK_FALSE) {
    local_1c = 0xd;
    ch_emit_write(&((comp->emit).emit_scope)->bytecode,&local_1c,1);
  }
  else if (op_1 == TK_TRUE) {
    local_18 = 0xe;
    ch_emit_write(&((comp->emit).emit_scope)->bytecode,&local_18,1);
  }
  else {
    error(comp,"Expected boolean expression");
  }
  return;
}

Assistant:

void boolean(ch_compilation* comp) {
  ch_token_kind kind = comp->previous.kind;

  switch(kind) {
    case TK_TRUE: 
      EMIT_OP(GET_EMIT(comp), OP_TRUE);
      return;
    case TK_FALSE: 
      EMIT_OP(GET_EMIT(comp), OP_FALSE);
      return;
    default:
      error(comp, "Expected boolean expression");
  }
}